

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_id.cc
# Opt level: O1

int MipsCpuCaps(char *cpuinfo_name)

{
  FILE *__stream;
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  char cpuinfo_line [512];
  char local_238;
  char cStack_237;
  char cStack_236;
  char cStack_235;
  char cStack_234;
  char cStack_233;
  char cStack_232;
  char cStack_231;
  char cStack_230;
  char cStack_22f;
  char cStack_22e;
  char cStack_22d;
  char cStack_22c;
  char cStack_22b;
  char cStack_22a;
  char cStack_229;
  
  __stream = fopen64(cpuinfo_name,"r");
  if (__stream == (FILE *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar3 = 0;
    uVar2 = 0;
    do {
      pcVar1 = fgets(&local_238,0x1ff,__stream);
      if (pcVar1 == (char *)0x0) goto LAB_0012aadb;
      if (cStack_230 == 'l' &&
          CONCAT17(cStack_231,
                   CONCAT16(cStack_232,
                            CONCAT15(cStack_233,
                                     CONCAT14(cStack_234,
                                              CONCAT13(cStack_235,
                                                       CONCAT12(cStack_236,
                                                                CONCAT11(cStack_237,local_238)))))))
          == 0x65646f6d20757063) {
        pcVar1 = strstr(&local_238,"Loongson-3");
        if (pcVar1 == (char *)0x0) {
          pcVar1 = strstr(&local_238,"Loongson-2K");
          uVar3 = uVar2;
          if (pcVar1 != (char *)0x0) {
            uVar2 = 0xc00000;
            uVar3 = 0xc00000;
          }
        }
        else {
          uVar2 = uVar2 | 0x800000;
          uVar3 = uVar2;
        }
      }
      auVar5[0] = -(local_238 == 'A');
      auVar5[1] = -(cStack_237 == 'S');
      auVar5[2] = -(cStack_236 == 'E');
      auVar5[3] = -(cStack_235 == 's');
      auVar5[4] = -(cStack_234 == ' ');
      auVar5[5] = -(cStack_233 == 'i');
      auVar5[6] = -(cStack_232 == 'm');
      auVar5[7] = -(cStack_231 == 'p');
      auVar5[8] = -(cStack_230 == 'l');
      auVar5[9] = -(cStack_22f == 'e');
      auVar5[10] = -(cStack_22e == 'm');
      auVar5[0xb] = -(cStack_22d == 'e');
      auVar5[0xc] = -(cStack_22c == 'n');
      auVar5[0xd] = -(cStack_22b == 't');
      auVar5[0xe] = -(cStack_22a == 'e');
      auVar5[0xf] = -(cStack_229 == 'd');
    } while ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar5[0xf] >> 7) << 0xf) != 0xffff);
    pcVar1 = strstr(&local_238,"loongson-mmi");
    uVar4 = uVar2;
    if (pcVar1 != (char *)0x0) {
      pcVar1 = strstr(&local_238,"loongson-ext");
      uVar3 = uVar2;
      if (pcVar1 != (char *)0x0) {
        uVar4 = uVar2 | 0x800000;
        uVar3 = uVar2 | 0x800000;
      }
    }
    pcVar1 = strstr(&local_238,"msa");
    uVar2 = uVar3;
    if (pcVar1 != (char *)0x0) {
      uVar2 = uVar4 | 0x400000;
    }
LAB_0012aadb:
    fclose(__stream);
  }
  return uVar2;
}

Assistant:

LIBYUV_API SAFEBUFFERS int MipsCpuCaps(const char* cpuinfo_name) {
  char cpuinfo_line[512];
  int flag = 0x0;
  FILE* f = fopen(cpuinfo_name, "r");
  if (!f) {
    // Assume nothing if /proc/cpuinfo is unavailable.
    // This will occur for Chrome sandbox for Pepper or Render process.
    return 0;
  }
  while (fgets(cpuinfo_line, sizeof(cpuinfo_line) - 1, f)) {
    if (memcmp(cpuinfo_line, "cpu model", 9) == 0) {
      // Workaround early kernel without mmi in ASEs line.
      if (strstr(cpuinfo_line, "Loongson-3")) {
        flag |= kCpuHasMMI;
      } else if (strstr(cpuinfo_line, "Loongson-2K")) {
        flag |= kCpuHasMMI | kCpuHasMSA;
      }
    }
    if (memcmp(cpuinfo_line, "ASEs implemented", 16) == 0) {
      if (strstr(cpuinfo_line, "loongson-mmi") &&
          strstr(cpuinfo_line, "loongson-ext")) {
        flag |= kCpuHasMMI;
      }
      if (strstr(cpuinfo_line, "msa")) {
        flag |= kCpuHasMSA;
      }
      // ASEs is the last line, so we can break here.
      break;
    }
  }
  fclose(f);
  return flag;
}